

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O1

void __thiscall
brown::Simulator::setpin
          (Simulator *this,int64_t clk,bool pulx,bool puly,bool dirx,bool diry,bool down)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  uint32_t uVar8;
  uint32_t *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint32_t ms;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint y;
  undefined1 auVar18 [16];
  double dVar19;
  bool dir [2];
  bool pul [2];
  byte local_34 [4];
  
  if ((this->pclk <= clk) && ((pulx || puly) || this->pclk != clk)) {
    if ((ulong)(this->CLKFRQ / 10) < clk - setpin::startClk) {
      uVar8 = App::getTime(this->app);
      lVar11 = clk - setpin::startClk;
      auVar18._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar18._0_8_ = lVar11;
      auVar18._12_4_ = 0x45300000;
      uVar12 = (uint)(long)((((auVar18._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                            1000.0) / (double)this->CLKFRQ + 0.0);
      ms = uVar12 - (uVar8 - setpin::startTime);
      if (uVar8 - setpin::startTime <= uVar12 && ms != 0) {
        App::delay(this->app,ms);
      }
      setpin::startClk = clk;
      setpin::startTime = App::getTime(this->app);
    }
    this->pclk = clk;
    if (this->fifn < this->FIFMAX) {
      this->fifclk[this->fifn] = clk;
      sVar6 = this->fifn;
      this->fifcurx[sVar6] = this->acur[0];
      this->fifcury[sVar6] = this->acur[1];
      this->fifbit[sVar6] = down << 4 | diry << 3 | dirx << 2 | puly * '\x02' | pulx;
      this->fifn = this->fifn + 1;
    }
    uVar12 = (this->BMPXRES >> 1) + (this->acur[0] >> 6);
    y = (this->BMPYRES >> 1) + (this->acur[1] >> 6);
    if (y < (uint)this->BMPYRES && uVar12 < (uint)this->BMPXRES) {
      puVar9 = Tile::getpix(&this->drawing,uVar12,y);
      if (down) {
        *puVar9 = 0xd0c0b0;
      }
      else if (*puVar9 == 0) {
        puVar9 = Tile::getpix(&this->drawing,uVar12,y);
        *puVar9 = 0x102030;
      }
    }
    lVar10 = (long)this->MAXT;
    lVar11 = this->CLKFRQ;
    iVar2 = this->MINT;
    iVar3 = this->MAXACC;
    iVar4 = this->MINPOS;
    iVar5 = this->MAXPOS;
    iVar14 = this->fault;
    lVar13 = 0;
    do {
      if (local_34[lVar13 + 2] == 1) {
        this->pulcount[lVar13] = this->pulcount[lVar13] + 1;
        lVar16 = this->oclk[lVar13];
        lVar7 = this->ooclk[lVar13];
        lVar17 = clk - lVar16;
        if (lVar10 <= lVar17) {
          this->killax[lVar13] = false;
        }
        iVar15 = (int)lVar13;
        if (lVar17 < 1) {
          if (iVar14 == 0) {
            iVar14 = iVar15 + 2;
            this->fault = iVar14;
            this->faultclk = clk;
          }
          this->killax[lVar13] = true;
        }
        else {
          lVar16 = lVar16 - lVar7;
          if (((lVar16 < lVar10 || lVar17 < lVar10) && (-1 < lVar7)) &&
             (this->odir[lVar13] != (uint)local_34[lVar13])) {
            if (iVar14 == 0) {
              iVar14 = iVar15 + 4;
              this->fault = iVar14;
              this->faultclk = clk;
            }
            this->killax[lVar13] = true;
          }
          if (((lVar17 < iVar2) && (-1 < this->oclk[lVar13])) && (iVar14 == 0)) {
            iVar14 = iVar15 + 6;
            this->fault = iVar14;
            this->faultclk = clk;
          }
          if (((lVar17 <= lVar10) && (lVar16 <= lVar10)) &&
             ((-1 < this->ooclk[lVar13] &&
              ((dVar19 = ABS((double)(lVar16 - lVar17)) * (double)lVar11 * (double)lVar11,
               (double)lVar16 * (double)lVar17 * (double)(lVar16 + lVar17) * (double)iVar3 <=
               dVar19 + dVar19 && (this->killax[lVar13] = true, iVar14 == 0)))))) {
            iVar14 = iVar15 + 8;
            this->fault = iVar14;
            this->faultclk = clk;
          }
          if (this->killax[lVar13] == false) {
            iVar15 = this->acur[lVar13] + (uint)local_34[lVar13] * 2 + -1;
            if (iVar15 <= iVar4) {
              iVar15 = iVar4;
            }
            if (iVar5 <= iVar15) {
              iVar15 = iVar5;
            }
            this->acur[lVar13] = iVar15;
          }
          bVar1 = local_34[lVar13];
          iVar15 = this->cur[lVar13] + (uint)bVar1 * 2 + -1;
          if (iVar15 <= iVar4) {
            iVar15 = iVar4;
          }
          if (iVar5 <= iVar15) {
            iVar15 = iVar5;
          }
          this->cur[lVar13] = iVar15;
          this->ooclk[lVar13] = this->oclk[lVar13];
          this->oclk[lVar13] = clk;
          this->odir[lVar13] = (uint)bVar1;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 == 1);
    this->odown = down;
    return;
  }
  App::delay(this->app,0xf);
  return;
}

Assistant:

void Simulator::setpin(std::int64_t clk, bool pulx, bool puly,
                       bool dirx, bool diry, bool down) {
    int x, y;
    bool pul[]{pulx, puly};
    bool dir[]{dirx, diry};

    /* Advance in time */
    if (clk < pclk || (clk==pclk && !pulx && !puly)) {
        app->delay(15);
        return;
    }
    // delay
    static std::uint32_t startTime = 0; // ms
    static std::uint64_t startClk = 0; // tick
    double delayTime = 0; // ms (for sub ms accuracy)
    if ((clk-startClk) > (CLKFRQ/10)) { // handle delay every 100 ms emulated time
        std::uint32_t elapsedTime = app->getTime() - startTime;
        delayTime += static_cast<double>((clk-startClk))*1000.0/TIME_SCALE/CLKFRQ;
        std::uint32_t delayTimeFloor = static_cast<std::uint32_t>(delayTime);
        if (delayTimeFloor > elapsedTime) {
            app->delay(delayTimeFloor-elapsedTime);
            delayTime -= delayTimeFloor;
        } else {
            delayTime = 0;
        }
        startClk = clk;
        startTime = app->getTime();
    }
    pclk = clk;

    /* Log data */
    if (fifn < FIFMAX) {
        fifclk[fifn] = clk;
        fifcurx[fifn] = acur[0];
        fifcury[fifn] = acur[1];
        fifbit[fifn] = pulx + (puly<<1) + (dirx<<2) + (diry<<3) + (down<<4);
        fifn++;
    }

    /* Draw previous pen location */
    x = (acur[0]>>6)+(BMPXRES>>1);
    y = (acur[1]>>6)+(BMPYRES>>1);
    if (((unsigned)x < (unsigned)BMPXRES)
    && ((unsigned)y < (unsigned)BMPYRES)) {
        if (down) {
            drawing.getpix(x, y) = DOWN_COLOR;
        }
        else if (drawing.getpix(x, y) == BACKGROUND_COLOR) {
            drawing.getpix(x, y) = UP_COLOR;
        }
    }

    /* Move pen and apply restriction*/
    for(int i = 0; i < 2; i++) {
        if (!pul[i]) {continue;}
#if ENABLE_RESTRICTION
        pulcount[i]++;
        std::int64_t t0 = clk - oclk[i];
        std::int64_t t1 = oclk[i] - ooclk[i];

        // Unlock axis after slowing down
        if (t0 >= MAXT) {killax[i] = false;}

        // Fault 2/3: zero clk between pulses
        if (t0 <= 0) {
            if (!fault) {fault = i+2; faultclk = clk;}
            killax[i] = 1; continue;
        }

        // Fault 4/5: change direction at high speed
        if (((t0 < MAXT) || (t1 < MAXT)) && (ooclk[i] >= 0) && (dir[i] != odir[i])) {
            if (!fault) {fault = i+4; faultclk = clk; }
            killax[i] = 1;
        }

        // Fault 6/7: speeding
        if ((t0 < MINT) && (oclk[i] >= 0)) {
            if (!fault) {fault = i+6; faultclk = clk;}
        }

        // Fault 8/9: over-acceleration
        if ((t0 <= MAXT) && (t1 <= MAXT) && (ooclk[i] >= 0)) {
            if (fabs((double)(t1-t0))*CLKFRQ*CLKFRQ*2.0 >= (double)(t0+t1)*t0*t1*MAXACC) {
                killax[i] = 1;
                if (!fault) {fault = i+8; faultclk = clk; }
            }
        }

        if (!killax[i]) {
            acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
        }
#else
        acur[i] = min(max(acur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);
#endif // ENABLE_RESTRICTION

        cur[i] = min(max(cur[i] + (dir[i]>0)*2-1,MINPOS),MAXPOS);

        ooclk[i] = oclk[i];
        oclk[i] = clk;
        odir[i] = dir[i];
    }
    odown = down;
}